

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
::
basic_methods_impl_mixin<unsigned_long&,std::function<void(std::__cxx11::string_const&)>&,std::function<void(std::exception_const&)>&>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
           *this,unsigned_long *args,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *args_1,function<void_(const_std::exception_&)> *args_2)

{
  size_t initial_heap_capacity;
  function<void_(const_std::exception_&)> local_78;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_48;
  function<void_(const_std::exception_&)> *local_28;
  function<void_(const_std::exception_&)> *args_local_2;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *args_local_1;
  unsigned_long *args_local;
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
  *this_local;
  
  local_28 = args_2;
  args_local_2 = (function<void_(const_std::exception_&)> *)args_1;
  args_local_1 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)args;
  args_local = (unsigned_long *)this;
  thread_mixin::thread_mixin((thread_mixin *)this);
  initial_heap_capacity = *(size_t *)&(args_local_1->super__Function_base)._M_functor;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_48,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)args_local_2);
  std::function<void_(const_std::exception_&)>::function(&local_78,local_28);
  timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::timer_heap_engine((timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                       *)(this + 0x68),initial_heap_capacity,&local_48,&local_78);
  std::function<void_(const_std::exception_&)>::~function(&local_78);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_48);
  return;
}

Assistant:

basic_methods_impl_mixin(
		ARGS && ... args )
		:	m_engine( std::forward< ARGS >(args)... )
	{
	}